

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O2

FILE * fopen_compchk(char *file,int32 *ispipe)

{
  undefined8 in_RAX;
  FILE *pFVar1;
  size_t sVar2;
  char *__dest;
  long ln;
  char *pcVar3;
  long lStack_40;
  int32 isgz;
  
  isgz = (int32)((ulong)in_RAX >> 0x20);
  pFVar1 = fopen_comp(file,"r",ispipe);
  if (pFVar1 != (FILE *)0x0) {
    return pFVar1;
  }
  guess_comptype(file,ispipe,&isgz);
  sVar2 = strlen(file);
  __dest = (char *)__ckd_calloc__(sVar2 + 5,1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/pio.c"
                                  ,0xdd);
  strcpy(__dest,file);
  switch(isgz) {
  case 0:
    builtin_strncpy(__dest + sVar2,".gz",4);
    pFVar1 = fopen_comp(__dest,"r",ispipe);
    if (pFVar1 == (FILE *)0x0) {
      pcVar3 = __dest + sVar2;
      builtin_strncpy(__dest + sVar2,".bz2",5);
      pFVar1 = fopen_comp(__dest,"r",ispipe);
      if (pFVar1 == (FILE *)0x0) {
        pcVar3[2] = '\0';
        pcVar3[0] = '.';
        pcVar3[1] = 'Z';
        pFVar1 = fopen_comp(__dest,"r",ispipe);
        if (pFVar1 == (FILE *)0x0) {
          ckd_free(__dest);
          return (FILE *)0x0;
        }
        ln = 0xf8;
      }
      else {
        ln = 0xf2;
      }
    }
    else {
      ln = 0xec;
    }
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/pio.c"
            ,ln,"Using %s instead of %s\n",__dest,file);
    goto LAB_0010b535;
  case 1:
    lStack_40 = -2;
    break;
  case 2:
    lStack_40 = -3;
    break;
  case 3:
    lStack_40 = -4;
    break;
  default:
    goto switchD_0010b4a5_default;
  }
  __dest[lStack_40 + sVar2] = '\0';
switchD_0010b4a5_default:
  pFVar1 = (FILE *)0x0;
  err_msg(ERR_WARN,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/pio.c"
          ,0xff,"Using %s instead of %s\n",__dest,file);
  fopen_comp(__dest,"r",ispipe);
LAB_0010b535:
  ckd_free(__dest);
  return pFVar1;
}

Assistant:

FILE *
fopen_compchk(const char *file, int32 * ispipe)
{
#ifndef HAVE_POPEN
    *ispipe = 0; /* No popen() on WinCE */
    /* And therefore the rest of this function is useless. */
    return (fopen_comp(file, "r", ispipe));
#else /* HAVE_POPEN */
    int32 isgz;
    FILE *fh;

    /* First just try to fopen_comp() it */
    if ((fh = fopen_comp(file, "r", ispipe)) != NULL)
        return fh;
    else {
        char *tmpfile;
        size_t k;

        /* File doesn't exist; try other compressed/uncompressed form, as appropriate */
        guess_comptype(file, ispipe, &isgz);
        k = strlen(file);
        tmpfile = ckd_calloc(k+5, 1);
        strcpy(tmpfile, file);
        switch (isgz) {
        case COMP_GZIP:
            tmpfile[k - 3] = '\0';
            break;
        case COMP_BZIP2:
            tmpfile[k - 4] = '\0';
            break;
        case COMP_COMPRESS:
            tmpfile[k - 2] = '\0';
            break;
        case COMP_NONE:
            strcpy(tmpfile + k, ".gz");
            if ((fh = fopen_comp(tmpfile, "r", ispipe)) != NULL) {
                E_WARN("Using %s instead of %s\n", tmpfile, file);
                ckd_free(tmpfile);
                return fh;
            }
            strcpy(tmpfile + k, ".bz2");
            if ((fh = fopen_comp(tmpfile, "r", ispipe)) != NULL) {
                E_WARN("Using %s instead of %s\n", tmpfile, file);
                ckd_free(tmpfile);
                return fh;
            }
            strcpy(tmpfile + k, ".Z");
            if ((fh = fopen_comp(tmpfile, "r", ispipe)) != NULL) {
                E_WARN("Using %s instead of %s\n", tmpfile, file);
                ckd_free(tmpfile);
                return fh;
            }
            ckd_free(tmpfile);
            return NULL;
        }
        E_WARN("Using %s instead of %s\n", tmpfile, file);
        fh = fopen_comp(tmpfile, "r", ispipe);
        ckd_free(tmpfile);
        return NULL;
    }
#endif /* HAVE_POPEN */
}